

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O3

int __thiscall
booster::locale::impl_icu::calendar_impl::difference
          (calendar_impl *this,abstract_calendar *other_ptr,period_mark p)

{
  UCalendarDateFields UVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  undefined4 extraout_var;
  ulong extraout_RDX;
  UErrorCode err;
  guard l;
  UErrorCode local_3c;
  double local_38;
  unique_lock<std::mutex> local_30;
  
  local_3c = U_ZERO_ERROR;
  plVar3 = (long *)(**(code **)(*(long *)(this->calendar_).ptr_ + 0x18))();
  if (other_ptr != (abstract_calendar *)0x0) {
    lVar4 = __dynamic_cast(other_ptr,&abstract_calendar::typeinfo,&typeinfo,0);
    if (lVar4 != 0) {
      local_30._M_device = (mutex_type *)(lVar4 + 8);
      local_30._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_30);
      local_30._M_owns = true;
      local_38 = (double)icu_70::Calendar::getTimeInMillis(*(UErrorCode **)(lVar4 + 0x50));
      check_and_throw_dt(&local_3c);
      std::unique_lock<std::mutex>::~unique_lock(&local_30);
      goto LAB_00181eca;
    }
  }
  iVar2 = (*other_ptr->_vptr_abstract_calendar[5])(other_ptr);
  local_38 = (double)CONCAT44(extraout_var,iVar2) * 1000.0 +
             (double)(extraout_RDX & 0xffffffff) / 1000000.0;
LAB_00181eca:
  UVar1 = to_icu(p);
  iVar2 = (**(code **)(*plVar3 + 0x58))(local_38,plVar3,UVar1,&local_3c);
  check_and_throw_dt(&local_3c);
  (**(code **)(*plVar3 + 8))(plVar3);
  return iVar2;
}

Assistant:

virtual int difference(abstract_calendar const *other_ptr,period::marks::period_mark p) const
        {
            UErrorCode err=U_ZERO_ERROR;
            double other_time = 0;
            //
            // fieldDifference has side effect of moving calendar (WTF?)
            // So we clone it for performing this operation
            // 
            std::unique_ptr<icu::Calendar> self(calendar_->clone());

            calendar_impl const *other_cal=dynamic_cast<calendar_impl const *>(other_ptr);
            if(other_cal){
                guard l(other_cal->lock_);
                other_time = other_cal->calendar_->getTime(err);
                check_and_throw_dt(err);
            }
            else {
                posix_time p = other_ptr->get_time();
                other_time = p.seconds * 1000.0 + p.nanoseconds / 1000000.0;
            }

            int diff = self->fieldDifference(other_time,to_icu(p),err);

            check_and_throw_dt(err);
            return diff;
        }